

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_commit_bid(filemgr *file,bid_t bid,uint64_t bmp_revnum,bool sync,
                  err_log_callback *log_callback)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  filemgr_header *pfVar11;
  char **ppcVar12;
  bool bVar13;
  uint8_t uVar14;
  atomic<unsigned_long> *paVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  uint64_t uVar23;
  byte in_CL;
  uint uVar24;
  ulong in_RDX;
  bid_t in_RSI;
  filemgr *in_RDI;
  ssize_t rv;
  uint8_t marker [1];
  void *buf;
  filemgr_magic_t magic;
  kvs_header *kv_header;
  uint16_t header_len;
  uint64_t exp_filesize;
  bool block_reusing;
  int result;
  filemgr_header_revnum_t _revnum;
  fdb_seqnum_t _seqnum;
  uint64_t _bmp_revnum;
  uint64_t _deltasize;
  bid_t _prev_bid;
  bid_t prev_bid;
  kvs_node *node;
  avl_node *a;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_fffffffffffffd38;
  memory_order in_stack_fffffffffffffd3c;
  filemgr *in_stack_fffffffffffffd40;
  bid_t in_stack_fffffffffffffd48;
  filemgr *in_stack_fffffffffffffd50;
  fdb_status local_2a4;
  filemgr *file_00;
  undefined1 local_161;
  void *local_160;
  ulong local_158;
  kvs_header *local_150;
  ushort local_142;
  uint64_t local_140;
  byte local_135;
  fdb_status local_134;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  uint64_t local_108;
  avl_node **local_100;
  avl_node *local_f8;
  byte local_e1;
  ulong local_e0;
  bid_t local_d8;
  filemgr *local_d0;
  fdb_status local_c4;
  __int_type_conflict local_c0;
  memory_order local_b8;
  int local_b4;
  atomic<unsigned_long> *local_b0;
  char *in_stack_ffffffffffffff58;
  memory_order in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  atomic<unsigned_long> *paVar25;
  fdb_status io_error;
  err_log_callback *in_stack_ffffffffffffff70;
  memory_order in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  
  io_error = (fdb_status)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_e1 = in_CL & 1;
  local_134 = FDB_RESULT_SUCCESS;
  local_135 = 0;
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  local_d0 = in_RDI;
  filemgr_set_io_inprog((filemgr *)0x1137c2);
  local_140 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                                  in_stack_fffffffffffffd3c);
  if ((global_config.ncacheblock < 1) ||
     (local_134 = bcache_flush(in_stack_fffffffffffffd40), local_134 == FDB_RESULT_SUCCESS)) {
    pthread_spin_lock(&local_d0->lock);
    local_142 = (local_d0->header).size;
    local_150 = local_d0->kv_header;
    local_158 = local_d0->version;
    if (((local_d0->header).size != 0) && ((local_d0->header).data != (void *)0x0)) {
      local_160 = _filemgr_get_temp_buf();
      memcpy(local_160,(local_d0->header).data,(ulong)local_142);
      uVar21 = (local_d0->header).revnum;
      uVar24 = (uint)uVar21;
      local_130 = uVar21 >> 0x38 | (ulong)((uint)(uVar21 >> 0x28) & 0xff00) |
                  (ulong)((uint)(uVar21 >> 0x18) & 0xff0000) | (uVar21 & 0xff00000000) >> 8 |
                  (ulong)(uVar24 & 0xff000000) << 8 | (ulong)(uVar24 & 0xff0000) << 0x18 |
                  (ulong)(uVar24 & 0xff00) << 0x28 | uVar21 << 0x38;
      *(ulong *)((long)local_160 + (ulong)local_142) = local_130;
      pfVar11 = &local_d0->header;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar21 = (pfVar11->seqnum).super___atomic_base<unsigned_long>._M_i;
      pfVar11 = &local_d0->header;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar22 = (pfVar11->seqnum).super___atomic_base<unsigned_long>._M_i;
      pfVar11 = &local_d0->header;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar1 = (pfVar11->seqnum).super___atomic_base<unsigned_long>._M_i;
      pfVar11 = &local_d0->header;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar2 = (pfVar11->seqnum).super___atomic_base<unsigned_long>._M_i;
      pfVar11 = &local_d0->header;
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      uVar3 = (pfVar11->seqnum).super___atomic_base<unsigned_long>._M_i;
      paVar25 = &(local_d0->header).seqnum;
      in_stack_ffffffffffffff7c = 5;
      in_stack_ffffffffffffff78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (in_stack_ffffffffffffff7c - 1U < 2) {
        in_stack_ffffffffffffff70 =
             (err_log_callback *)(paVar25->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (in_stack_ffffffffffffff7c == 5) {
        in_stack_ffffffffffffff70 =
             (err_log_callback *)(paVar25->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        in_stack_ffffffffffffff70 =
             (err_log_callback *)(paVar25->super___atomic_base<unsigned_long>)._M_i;
      }
      uVar9 = (ulong)in_stack_ffffffffffffff70 >> 0x10;
      paVar15 = &(local_d0->header).seqnum;
      in_stack_ffffffffffffff64 = 5;
      paVar25 = paVar15;
      in_stack_ffffffffffffff60 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (in_stack_ffffffffffffff64 - 1U < 2) {
        in_stack_ffffffffffffff58 = (char *)(paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (in_stack_ffffffffffffff64 == 5) {
        in_stack_ffffffffffffff58 = (char *)(paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        in_stack_ffffffffffffff58 = (char *)(paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      uVar10 = (ulong)in_stack_ffffffffffffff58 >> 8;
      paVar15 = &(local_d0->header).seqnum;
      local_b4 = 5;
      local_b0 = paVar15;
      local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_b4 - 1U < 2) {
        local_c0 = (paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_b4 == 5) {
        local_c0 = (paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_c0 = (paVar15->super___atomic_base<unsigned_long>)._M_i;
      }
      local_128 = uVar21 >> 0x38 | (uVar22 >> 0x30 & 0xff) << 8 | (uVar1 >> 0x28 & 0xff) << 0x10 |
                  (uVar2 >> 0x20 & 0xff) << 0x18 | (uVar3 >> 0x18 & 0xff) << 0x20 |
                  (uVar9 & 0xff) << 0x28 | (uVar10 & 0xff) << 0x30 | local_c0 << 0x38;
      *(ulong *)((long)local_160 + (long)(int)(uint)local_142 + 8) = local_128;
      if (local_d0->sb != (superblock *)0x0) {
        local_120 = local_e0 >> 0x38 | (local_e0 & 0xff000000000000) >> 0x28 |
                    (local_e0 & 0xff0000000000) >> 0x18 | (local_e0 & 0xff00000000) >> 8 |
                    (local_e0 & 0xff000000) << 8 | (local_e0 & 0xff0000) << 0x18 |
                    (local_e0 & 0xff00) << 0x28 | local_e0 << 0x38;
        *(ulong *)((long)local_160 + ((ulong)local_d0->blocksize - 0x23)) = local_120;
      }
      lVar4 = (local_d0->header).stat.deltasize;
      sVar16 = wal_get_datasize((filemgr *)0x114143);
      lVar5 = (local_d0->header).stat.deltasize;
      sVar17 = wal_get_datasize((filemgr *)0x114185);
      lVar6 = (local_d0->header).stat.deltasize;
      sVar18 = wal_get_datasize((filemgr *)0x1141cf);
      lVar7 = (local_d0->header).stat.deltasize;
      sVar19 = wal_get_datasize((filemgr *)0x114219);
      lVar8 = (local_d0->header).stat.deltasize;
      sVar20 = wal_get_datasize((filemgr *)0x114263);
      uVar21 = lVar4 + sVar16 >> 0x38 | (lVar5 + sVar17 & 0xff000000000000) >> 0x28 |
               (lVar6 + sVar18 & 0xff0000000000) >> 0x18 | (lVar7 + sVar19 & 0xff00000000) >> 8 |
               (lVar8 + sVar20 & 0xff000000) << 8;
      lVar4 = (local_d0->header).stat.deltasize;
      sVar16 = wal_get_datasize((filemgr *)0x1142ad);
      uVar22 = uVar21 | (lVar4 + sVar16 & 0xff0000) << 0x18;
      file_00 = (filemgr *)(local_d0->header).stat.deltasize;
      sVar16 = wal_get_datasize((filemgr *)0x1142f7);
      ppcVar12 = &file_00->filename;
      lVar4 = (local_d0->header).stat.deltasize;
      sVar17 = wal_get_datasize((filemgr *)0x114347);
      io_error = (fdb_status)((ulong)paVar25 >> 0x20);
      local_118 = uVar22 | ((long)ppcVar12 + sVar16 & 0xff00) << 0x28 | lVar4 + sVar17 << 0x38;
      *(ulong *)((long)local_160 + ((ulong)local_d0->blocksize - 0x1b)) = local_118;
      (local_d0->header).stat.deltasize = 0;
      if (local_150 != (kvs_header *)0x0) {
        local_f8 = avl_first(local_150->idx_id);
        while (io_error = (fdb_status)((ulong)paVar25 >> 0x20), local_f8 != (avl_node *)0x0) {
          local_100 = &local_f8[-8].left;
          local_f8 = avl_next(local_f8);
          local_100[0x13] = (avl_node *)0x0;
        }
      }
      local_108 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                                      in_stack_fffffffffffffd3c);
      local_110 = local_108 >> 0x38 | (local_108 & 0xff000000000000) >> 0x28 |
                  (local_108 & 0xff0000000000) >> 0x18 | (local_108 & 0xff00000000) >> 8 |
                  (local_108 & 0xff000000) << 8 | (local_108 & 0xff0000) << 0x18 |
                  (local_108 & 0xff00) << 0x28 | local_108 << 0x38;
      *(ulong *)((long)local_160 + ((ulong)local_d0->blocksize - 0x13)) = local_110;
      local_142 = local_142 >> 8 | local_142 << 8;
      *(ushort *)((long)local_160 + ((ulong)local_d0->blocksize - 0xb)) = local_142;
      local_158 = local_158 >> 0x38 | (local_158 & 0xff000000000000) >> 0x28 |
                  (local_158 & 0xff0000000000) >> 0x18 | (local_158 & 0xff00000000) >> 8 |
                  (local_158 & 0xff000000) << 8 | (local_158 & 0xff0000) << 0x18 |
                  (local_158 & 0xff00) << 0x28 | local_158 << 0x38;
      *(ulong *)((long)local_160 + ((ulong)local_d0->blocksize - 9)) = local_158;
      memset(&local_161,0xee,1);
      *(undefined1 *)((long)local_160 + ((ulong)local_d0->blocksize - 1)) = local_161;
      if (local_d8 == 0xffffffffffffffff) {
        uVar23 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                                     in_stack_fffffffffffffd3c);
        local_d8 = uVar23 / local_d0->blocksize;
        local_135 = 0;
      }
      else {
        local_135 = 1;
        bcache_invalidate_block(file_00,uVar21);
      }
      uVar21 = filemgr_write_blocks(local_d0,local_160,1,local_d8);
      _log_errno_str((filemgr_ops *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,io_error,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
      if (uVar21 != local_d0->blocksize) {
        _filemgr_release_temp_buf(in_stack_fffffffffffffd40);
        pthread_spin_unlock(&local_d0->lock);
        filemgr_clear_io_inprog((filemgr *)0x1147c2);
        if ((long)uVar21 < 0) {
          local_2a4 = (fdb_status)uVar21;
        }
        else {
          local_2a4 = FDB_RESULT_WRITE_FAIL;
        }
        return local_2a4;
      }
      if (local_108 != 0) {
        filemgr_add_stale_block
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                   (size_t)in_stack_fffffffffffffd40);
      }
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),memory_order_relaxed)
      ;
      if ((local_135 & 1) == 0) {
        atomic_add_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                            memory_order_relaxed);
      }
      _filemgr_release_temp_buf(in_stack_fffffffffffffd40);
    }
    bVar13 = sb_bmp_exists((superblock *)
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (((bVar13) &&
        (uVar23 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                                      in_stack_fffffffffffffd3c), uVar23 != 0xffffffffffffffff)) &&
       (uVar14 = atomic_get_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffd40,
                                    in_stack_fffffffffffffd3c), uVar14 == '\0')) {
      atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd3c);
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),memory_order_relaxed)
      ;
      filemgr_get_sb_bmp_revnum
                ((filemgr *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),memory_order_relaxed)
      ;
    }
    else {
      in_stack_fffffffffffffd40 = (filemgr *)&local_d0->last_commit;
      atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd3c);
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),memory_order_relaxed)
      ;
    }
    pthread_spin_unlock(&local_d0->lock);
    if ((local_e1 & 1) != 0) {
      local_134 = (*local_d0->ops->fsync)(local_d0->fd);
      _log_errno_str((filemgr_ops *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,io_error,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
    }
    atomic_init_uint64_t
              ((atomic<unsigned_long> *)in_stack_fffffffffffffd40,
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    filemgr_clear_io_inprog((filemgr *)0x114a57);
    local_c4 = local_134;
  }
  else {
    _log_errno_str((filemgr_ops *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff70,io_error,
                   (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
    filemgr_clear_io_inprog((filemgr *)0x113849);
    local_c4 = local_134;
  }
  return local_c4;
}

Assistant:

fdb_status filemgr_commit_bid(struct filemgr *file, bid_t bid,
                              uint64_t bmp_revnum, bool sync,
                              err_log_callback *log_callback)
{
    struct avl_node *a;
    struct kvs_node *node;
    bid_t prev_bid, _prev_bid;
    uint64_t _deltasize, _bmp_revnum;
    fdb_seqnum_t _seqnum;
    filemgr_header_revnum_t _revnum;
    int result = FDB_RESULT_SUCCESS;
    bool block_reusing = false;

    filemgr_set_io_inprog(file);
    uint64_t exp_filesize = atomic_get_uint64_t(&file->pos);
    if (global_config.ncacheblock > 0) {
        result = bcache_flush(file);
        if (result != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status) result,
                           "FLUSH", file->filename);
            filemgr_clear_io_inprog(file);
            return (fdb_status)result;
        }
    }

    spin_lock(&file->lock);

    uint16_t header_len = file->header.size;
    struct kvs_header *kv_header = file->kv_header;
    filemgr_magic_t magic = file->version;

    if (file->header.size > 0 && file->header.data) {
        void *buf = _filemgr_get_temp_buf();
        uint8_t marker[BLK_MARKER_SIZE];

        // [header data]:        'header_len' bytes   <---+
        // [header revnum]:      8 bytes                  |
        // [default KVS seqnum]: 8 bytes                  |
        // ...                                            |
        // (empty)                                    blocksize
        // ...                                            |
        // [SB bitmap revnum]:   8 bytes                  |
        // [Delta size]:         8 bytes                  |
        // [prev header bid]:    8 bytes                  |
        // [header length]:      2 bytes                  |
        // [magic number]:       8 bytes                  |
        // [block marker]:       1 byte               <---+

        // header data
        memcpy(buf, file->header.data, header_len);
        // header rev number
        _revnum = _endian_encode(file->header.revnum);
        memcpy((uint8_t *)buf + header_len, &_revnum,
               sizeof(filemgr_header_revnum_t));
        // file's sequence number (default KVS seqnum)
        _seqnum = _endian_encode(file->header.seqnum.load());
        memcpy((uint8_t *)buf + header_len + sizeof(filemgr_header_revnum_t),
               &_seqnum, sizeof(fdb_seqnum_t));

        // current header's sb bmp revision number
        if (file->sb) {
            _bmp_revnum = _endian_encode(bmp_revnum);
            memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
                   - sizeof(header_len) - sizeof(_prev_bid)
                   - sizeof(_deltasize) - sizeof(_bmp_revnum)
                   - BLK_MARKER_SIZE),
                   &_bmp_revnum, sizeof(_bmp_revnum));
        }

        // delta size since prior commit
        _deltasize = _endian_encode(file->header.stat.deltasize //index+data
                                  + wal_get_datasize(file)); // wal datasize
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - sizeof(_prev_bid)*2 - BLK_MARKER_SIZE),
               &_deltasize, sizeof(_deltasize));

        // Reset in-memory delta size of the header for next commit...
        file->header.stat.deltasize = 0; // single kv store header
        if (kv_header) { // multi kv store stats
            a = avl_first(kv_header->idx_id);
            while (a) {
                node = _get_entry(a, struct kvs_node, avl_id);
                a = avl_next(&node->avl_id);
                node->stat.deltasize = 0;
            }
        }

        // prev header bid
        prev_bid = atomic_get_uint64_t(&file->header.bid);
        _prev_bid = _endian_encode(prev_bid);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - sizeof(_prev_bid) - BLK_MARKER_SIZE),
               &_prev_bid, sizeof(_prev_bid));
        // header length
        header_len = _endian_encode(header_len);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - BLK_MARKER_SIZE),
               &header_len, sizeof(header_len));
        // magic number
        magic = _endian_encode(magic);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - BLK_MARKER_SIZE), &magic, sizeof(magic));

        // marker
        memset(marker, BLK_MARKER_DBHEADER, BLK_MARKER_SIZE);
        memcpy((uint8_t *)buf + file->blocksize - BLK_MARKER_SIZE,
               marker, BLK_MARKER_SIZE);

        if (bid == BLK_NOT_FOUND) {
            // append header at the end of file
            bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
            block_reusing = false;
        } else {
            // write header in the allocated (reused) block
            block_reusing = true;
            // we MUST invalidate the header block 'bid', since previous
            // contents of 'bid' may remain in block cache and cause data
            // inconsistency if reading header block hits the cache.
            bcache_invalidate_block(file, bid);
        }

        ssize_t rv = filemgr_write_blocks(file, buf, 1, bid);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv,
                       "WRITE", file->filename);
        if (rv != (ssize_t)file->blocksize) {
            _filemgr_release_temp_buf(buf);
            spin_unlock(&file->lock);
            filemgr_clear_io_inprog(file);
            return rv < 0 ? (fdb_status) rv : FDB_RESULT_WRITE_FAIL;
        }

        if (prev_bid) {
            // mark prev DB header as stale
            filemgr_add_stale_block(file, prev_bid * file->blocksize, file->blocksize);
        }

        atomic_store_uint64_t(&file->header.bid, bid);
        if (!block_reusing) {
            atomic_add_uint64_t(&file->pos, file->blocksize);
        }

        _filemgr_release_temp_buf(buf);
    }

    if (sb_bmp_exists(file->sb) &&
        atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND &&
        atomic_get_uint8_t(&file->status) == FILE_NORMAL) {
        // block reusing is currently enabled
        atomic_store_uint64_t(&file->last_commit,
            atomic_get_uint64_t(&file->sb->cur_alloc_bid) * file->blocksize);
        // Since some more blocks may be allocated after the header block
        // (for storing BMP data or system docs for stale info)
        // so that the block pointed to by 'cur_alloc_bid' may have
        // different BMP revision number. So we have to use the
        // up-to-date bmp_revnum here.
        atomic_store_uint64_t(&file->last_writable_bmp_revnum,
                              filemgr_get_sb_bmp_revnum(file));
    } else {
        atomic_store_uint64_t(&file->last_commit, atomic_get_uint64_t(&file->pos));
        // WARNING: if `last_commit` is at the end of file,
        //          we should NOT update `last_writable_bmp_revnum`.
    }

    spin_unlock(&file->lock);

    if (sync) {
        result = file->ops->fsync(file->fd);
        _log_errno_str(file->ops, log_callback, (fdb_status)result,
                       "FSYNC", file->filename);
    }
    atomic_init_uint64_t(&file->latest_filesize, exp_filesize);

    filemgr_clear_io_inprog(file);
    return (fdb_status) result;
}